

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O2

void __thiscall
chatra::UserObjectBase::UserObjectBase(UserObjectBase *this,Storage *storage,Class *cl)

{
  ObjectBase::ObjectBase(&this->super_ObjectBase,storage,Dummy,cl);
  (this->super_ObjectBase).super_Object._vptr_Object = (_func_int **)&PTR__UserObjectBase_0023d808;
  this->deinitCalled = false;
  (this->nativePtr)._M_t.
  super___uniq_ptr_impl<chatra::INativePtr,_std::default_delete<chatra::INativePtr>_>._M_t.
  super__Tuple_impl<0UL,_chatra::INativePtr_*,_std::default_delete<chatra::INativePtr>_>.
  super__Head_base<0UL,_chatra::INativePtr_*,_false>._M_head_impl = (INativePtr *)0x0;
  (this->uninitializedParents)._M_h._M_buckets = &(this->uninitializedParents)._M_h._M_single_bucket
  ;
  (this->uninitializedParents)._M_h._M_bucket_count = 1;
  (this->uninitializedParents)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uninitializedParents)._M_h._M_element_count = 0;
  (this->uninitializedParents)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->uninitializedParents)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uninitializedParents)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__detail::
  _Insert_base<chatra::Class_const*,chatra::Class_const*,std::allocator<chatra::Class_const*>,std::__detail::_Identity,std::equal_to<chatra::Class_const*>,std::hash<chatra::Class_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::insert<std::__detail::_Node_const_iterator<chatra::Class_const*,true,false>>
            ((_Insert_base<chatra::Class_const*,chatra::Class_const*,std::allocator<chatra::Class_const*>,std::__detail::_Identity,std::equal_to<chatra::Class_const*>,std::hash<chatra::Class_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->uninitializedParents,
             (_Node_const_iterator<const_chatra::Class_*,_true,_false>)
             (cl->parentsSet)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<const_chatra::Class_*,_true,_false>)0x0);
  return;
}

Assistant:

UserObjectBase(Storage& storage, const Class* cl) noexcept : ObjectBase(storage, typeId_UserObjectBase, cl) {
		uninitializedParents.insert(cl->refParents().cbegin(), cl->refParents().cend());
	}